

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void CheckLength(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  Bool BVar4;
  uint code;
  char *pcVar5;
  
  if ((attval != (AttVal *)0x0) && (pcVar5 = attval->value, pcVar5 != (char *)0x0)) {
    if ((((attval->dict == (Attribute *)0x0) || (node == (Node *)0x0)) ||
        (attval->dict->id != TidyAttr_WIDTH)) ||
       ((node->tag == (Dict *)0x0 || (1 < node->tag->id - TidyTag_COL)))) {
      BVar4 = prvTidyIsDigit((int)*pcVar5);
      if (BVar4 == no) {
LAB_0013db7a:
        code = 0x22b;
        goto LAB_0013db88;
      }
      cVar3 = pcVar5[1];
      if (cVar3 != '\0') {
        pcVar5 = pcVar5 + 2;
        bVar1 = false;
        do {
          if ((bVar1) || (bVar2 = true, cVar3 != '%')) {
            if (bVar1) goto LAB_0013db7a;
            BVar4 = prvTidyIsDigit((int)cVar3);
            bVar2 = false;
            if (BVar4 == no) goto LAB_0013db7a;
          }
          bVar1 = bVar2;
          cVar3 = *pcVar5;
          pcVar5 = pcVar5 + 1;
        } while (cVar3 != '\0');
      }
    }
    return;
  }
  code = 0x256;
LAB_0013db88:
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

void CheckLength( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    tmbstr p;
    
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* don't check for <col width=...> and <colgroup width=...> */
    if (attrIsWIDTH(attval) && (nodeIsCOL(node) || nodeIsCOLGROUP(node)))
        return;

    p = attval->value;
    
    if (!TY_(IsDigit)(*p++))
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
    else
    {
        Bool percentFound = no;
        while (*p)
        {
            if (!percentFound && *p == '%')
            {
                percentFound = yes;
            }
            else if (percentFound || !TY_(IsDigit)(*p))
            {
                TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
                break;
            }

            ++p;
        }
    }
}